

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

void __thiscall namedlabels::namedlabels(namedlabels *this,string *label_list)

{
  char *__s;
  pointer psVar1;
  void *key;
  char *__dest;
  size_t __n;
  uint64_t hash;
  unsigned_long *puVar2;
  ostream *os;
  vw_exception *this_00;
  long lVar3;
  v_hashmap<substring,_unsigned_long> *this_01;
  unsigned_long uVar4;
  substring *key_00;
  size_t nmemb;
  substring s;
  unsigned_long local_1e0;
  string local_1d8;
  substring l_copy;
  ostream local_1a8;
  
  (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = &this->name2id;
  v_hashmap<substring,_unsigned_long>::v_hashmap(this_01);
  __dest = calloc_or_throw<char>(label_list->_M_string_length + 1);
  __s = (label_list->_M_dataplus)._M_p;
  __n = strlen(__s);
  memcpy(__dest,__s,__n);
  s.end = __dest + label_list->_M_string_length;
  s.begin = __dest;
  tokenize<std::vector<substring,std::allocator<substring>>>(',',s,&this->id2name,false);
  this->K = (uint32_t)
            ((ulong)((long)(this->id2name).super__Vector_base<substring,_std::allocator<substring>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 4);
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::delete_v(&(this->name2id).dat);
  l_copy.begin = (char *)0x0;
  v_hashmap<substring,_unsigned_long>::init(this_01,(EVP_PKEY_CTX *)(ulong)(this->K * 4 + 1));
  uVar4 = 1;
  lVar3 = 0;
  while( true ) {
    if ((ulong)this->K <= uVar4 - 1) {
      return;
    }
    psVar1 = (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
             super__Vector_impl_data._M_start;
    key = *(void **)((long)&psVar1->begin + lVar3);
    hash = uniform_hash(key,*(long *)((long)&psVar1->end + lVar3) - (long)key,0x5c621);
    key_00 = (substring *)((long)&psVar1->begin + lVar3);
    puVar2 = v_hashmap<substring,_unsigned_long>::get(this_01,key_00,hash);
    if (*puVar2 != 0) break;
    nmemb = (long)key_00->end - (long)key_00->begin;
    l_copy.begin = calloc_or_throw<char>(nmemb);
    l_copy.end = (char *)0x0;
    memcpy(l_copy.begin,key_00->begin,nmemb);
    l_copy.end = l_copy.begin + nmemb;
    local_1e0 = uVar4;
    v_hashmap<substring,_unsigned_long>::put(this_01,&l_copy,hash,&local_1e0);
    lVar3 = lVar3 + 0x10;
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&l_copy);
  os = std::operator<<(&local_1a8,
                       "error: label dictionary initialized with multiple occurances of: ");
  ::operator<<(os,key_00);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/global_data.h"
             ,0xbe,&local_1d8);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

namedlabels(std::string label_list)
  {
    char* temp = calloc_or_throw<char>(1 + label_list.length());
    memcpy(temp, label_list.c_str(), strlen(label_list.c_str()));
    substring ss = {temp, nullptr};
    ss.end = ss.begin + label_list.length();
    tokenize(',', ss, id2name);

    K = (uint32_t)id2name.size();
    name2id.delete_v();  // delete automatically allocated vector.
    name2id.init(4 * K + 1, 0, substring_equal);
    for (size_t k = 0; k < K; k++)
    {
      substring& l = id2name[k];
      uint64_t hash = uniform_hash((unsigned char*)l.begin, l.end - l.begin, 378401);
      uint64_t id = name2id.get(l, hash);
      if (id != 0)  // TODO: memory leak: char* temp
        THROW("error: label dictionary initialized with multiple occurances of: " << l);
      size_t len = l.end - l.begin;
      substring l_copy = {calloc_or_throw<char>(len), nullptr};
      memcpy(l_copy.begin, l.begin, len * sizeof(char));
      l_copy.end = l_copy.begin + len;
      name2id.put(l_copy, hash, k + 1);
    }
  }